

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  string *filename;
  EnumDescriptor *this_00;
  ServiceDescriptor *this_01;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_02;
  EnumGenerator *this_03;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar6;
  MessageGenerator *pMVar7;
  scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator> *this_04;
  ServiceGenerator *this_05;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_06;
  ExtensionGenerator *this_07;
  Printer *pPVar8;
  int local_84;
  int local_80;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int local_4c;
  int local_48;
  int i_1;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  filename = FileDescriptor::name_abi_cxx11_(this->file_);
  StripProto(&local_38,filename);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n#include \"$basename$.pb.h\"\n\n#include <algorithm>\n\n#include <google/protobuf/stubs/common.h>\n#include <google/protobuf/stubs/once.h>\n#include <google/protobuf/io/coded_stream.h>\n#include <google/protobuf/wire_format_lite_inl.h>\n"
                     ,"filename",psVar5,"basename",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = HasDescriptorMethods(this->file_);
  if (bVar2) {
    io::Printer::Print(local_18,
                       "#include <google/protobuf/descriptor.h>\n#include <google/protobuf/generated_message_reflection.h>\n#include <google/protobuf/reflection_ops.h>\n#include <google/protobuf/wire_format.h>\n"
                      );
  }
  io::Printer::Print(local_18,"// @@protoc_insertion_point(includes)\n");
  GenerateNamespaceOpeners(this,local_18);
  bVar2 = HasDescriptorMethods(this->file_);
  if (bVar2) {
    io::Printer::Print(local_18,"\nnamespace {\n\n");
    for (local_48 = 0; iVar4 = local_48, iVar3 = FileDescriptor::message_type_count(this->file_),
        iVar4 < iVar3; local_48 = local_48 + 1) {
      psVar6 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,(long)local_48);
      pMVar7 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                         (psVar6);
      MessageGenerator::GenerateDescriptorDeclarations(pMVar7,local_18);
    }
    for (local_4c = 0; iVar4 = local_4c, iVar3 = FileDescriptor::enum_type_count(this->file_),
        pPVar1 = local_18, iVar4 < iVar3; local_4c = local_4c + 1) {
      pPVar8 = local_18;
      this_00 = FileDescriptor::enum_type(this->file_,local_4c);
      ClassName_abi_cxx11_((string *)&i_3,(cxx *)this_00,(EnumDescriptor *)0x0,SUB81(pPVar8,0));
      io::Printer::Print(pPVar1,
                         "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
                         "name",(string *)&i_3);
      std::__cxx11::string::~string((string *)&i_3);
    }
    bVar2 = HasGenericServices(this->file_);
    if (bVar2) {
      for (i_4 = 0; iVar4 = FileDescriptor::service_count(this->file_), pPVar1 = local_18,
          i_4 < iVar4; i_4 = i_4 + 1) {
        this_01 = FileDescriptor::service(this->file_,i_4);
        psVar5 = ServiceDescriptor::name_abi_cxx11_(this_01);
        io::Printer::Print(pPVar1,
                           "const ::google::protobuf::ServiceDescriptor* $name$_descriptor_ = NULL;\n"
                           ,"name",psVar5);
      }
    }
    io::Printer::Print(local_18,"\n}  // namespace\n\n");
  }
  GenerateBuildDescriptors(this,local_18);
  for (i_5 = 0; iVar4 = FileDescriptor::enum_type_count(this->file_), i_5 < iVar4; i_5 = i_5 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
              ::operator[](&this->enum_generators_,(long)i_5);
    this_03 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                        (this_02);
    EnumGenerator::GenerateMethods(this_03,local_18);
  }
  for (i_6 = 0; iVar4 = FileDescriptor::message_type_count(this->file_), i_6 < iVar4; i_6 = i_6 + 1)
  {
    io::Printer::Print(local_18,"\n");
    io::Printer::Print(local_18,
                       "// ===================================================================\n");
    io::Printer::Print(local_18,"\n");
    psVar6 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)i_6);
    pMVar7 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar6);
    MessageGenerator::GenerateClassMethods(pMVar7,local_18);
  }
  bVar2 = HasGenericServices(this->file_);
  if (bVar2) {
    for (local_80 = 0; iVar4 = FileDescriptor::service_count(this->file_), local_80 < iVar4;
        local_80 = local_80 + 1) {
      if (local_80 == 0) {
        io::Printer::Print(local_18,"\n");
      }
      io::Printer::Print(local_18,
                         "// ===================================================================\n")
      ;
      io::Printer::Print(local_18,"\n");
      this_04 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>_>
                ::operator[](&this->service_generators_,(long)local_80);
      this_05 = internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>::operator->
                          (this_04);
      ServiceGenerator::GenerateImplementation(this_05,local_18);
    }
  }
  for (local_84 = 0; iVar4 = FileDescriptor::extension_count(this->file_), local_84 < iVar4;
      local_84 = local_84 + 1) {
    this_06 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)local_84);
    this_07 = internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->
                        (this_06);
    ExtensionGenerator::GenerateDefinition(this_07,local_18);
  }
  io::Printer::Print(local_18,"\n// @@protoc_insertion_point(namespace_scope)\n");
  GenerateNamespaceClosers(this,local_18);
  io::Printer::Print(local_18,"\n// @@protoc_insertion_point(global_scope)\n");
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"

    // The generated code calls accessors that might be deprecated. We don't
    // want the compiler to warn in generated code.
    "#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n"
    "#include \"$basename$.pb.h\"\n"
    "\n"
    "#include <algorithm>\n"    // for swap()
    "\n"
    "#include <google/protobuf/stubs/common.h>\n"
    "#include <google/protobuf/stubs/once.h>\n"
    "#include <google/protobuf/io/coded_stream.h>\n"
    "#include <google/protobuf/wire_format_lite_inl.h>\n",
    "filename", file_->name(),
    "basename", StripProto(file_->name()));

  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "#include <google/protobuf/descriptor.h>\n"
      "#include <google/protobuf/generated_message_reflection.h>\n"
      "#include <google/protobuf/reflection_ops.h>\n"
      "#include <google/protobuf/wire_format.h>\n");
  }

  printer->Print(
    "// @@protoc_insertion_point(includes)\n");

  GenerateNamespaceOpeners(printer);

  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "\n"
      "namespace {\n"
      "\n");
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateDescriptorDeclarations(printer);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      printer->Print(
        "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
        "name", ClassName(file_->enum_type(i), false));
    }

    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        printer->Print(
          "const ::google::protobuf::ServiceDescriptor* $name$_descriptor_ = NULL;\n",
          "name", file_->service(i)->name());
      }
    }

    printer->Print(
      "\n"
      "}  // namespace\n"
      "\n");
  }

  // Define our externally-visible BuildDescriptors() function.  (For the lite
  // library, all this does is initialize default instances.)
  GenerateBuildDescriptors(printer);

  // Generate enums.
  for (int i = 0; i < file_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  // Generate classes.
  for (int i = 0; i < file_->message_type_count(); i++) {
    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
    message_generators_[i]->GenerateClassMethods(printer);
  }

  if (HasGenericServices(file_)) {
    // Generate services.
    for (int i = 0; i < file_->service_count(); i++) {
      if (i == 0) printer->Print("\n");
      printer->Print(kThickSeparator);
      printer->Print("\n");
      service_generators_[i]->GenerateImplementation(printer);
    }
  }

  // Define extensions.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  GenerateNamespaceClosers(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n");
}